

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::ExtractScene(BlenderImporter *this,Scene *out,FileDatabase *file)

{
  pointer pcVar1;
  ulong uVar2;
  pointer pFVar3;
  pointer pFVar4;
  pointer pSVar5;
  StreamReader<true,_true> *this_00;
  const_iterator cVar6;
  Logger *this_01;
  pointer pFVar7;
  pointer pFVar8;
  char *local_1c0;
  char local_1b0 [16];
  undefined1 local_1a0 [376];
  
  pcVar1 = local_1a0 + 0x10;
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"Scene","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(file->dna).indices._M_t,(key_type *)local_1a0);
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_);
  }
  if ((_Rb_tree_header *)cVar6._M_node == &(file->dna).indices._M_t._M_impl.super__Rb_tree_header) {
    local_1a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"There is no `Scene` structure record","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_1a0);
    if ((pointer)local_1a0._0_8_ != pcVar1) {
      operator_delete((void *)local_1a0._0_8_);
    }
  }
  uVar2 = *(ulong *)(cVar6._M_node + 2);
  pFVar3 = (file->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           .
           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar4 = (file->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           .
           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar3 == pFVar4) {
    pFVar8 = (pointer)0x0;
  }
  else {
    do {
      pFVar7 = pFVar3 + 1;
      pFVar8 = pFVar3;
      if (uVar2 == pFVar3->dna_index) break;
      pFVar8 = (pointer)0x0;
      pFVar3 = pFVar7;
    } while (pFVar7 != pFVar4);
  }
  pSVar5 = (file->dna).structures.
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar8 == (pointer)0x0) {
    local_1a0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"There is not a single `Scene` record to load","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_1a0);
    if ((pointer)local_1a0._0_8_ != pcVar1) {
      operator_delete((void *)local_1a0._0_8_);
    }
  }
  this_00 = (file->reader).
            super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  StreamReader<true,_true>::SetPtr(this_00,this_00->buffer + pFVar8->start);
  Blender::Structure::Convert<Assimp::Blender::Scene>(pSVar5 + uVar2,out,file);
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             (char (*) [22])"(Stats) Fields read: ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,", pointers resolved: ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", cache hits: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", cached objects: ",0x12)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  Logger::info(this_01,local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void BlenderImporter::ExtractScene(Scene& out, const FileDatabase& file)
{
    const FileBlockHead* block = NULL;
    std::map<std::string,size_t>::const_iterator it = file.dna.indices.find("Scene");
    if (it == file.dna.indices.end()) {
        ThrowException("There is no `Scene` structure record");
    }

    const Structure& ss = file.dna.structures[(*it).second];

    // we need a scene somewhere to start with.
    for(const FileBlockHead& bl :file.entries) {

        // Fix: using the DNA index is more reliable to locate scenes
        //if (bl.id == "SC") {

        if (bl.dna_index == (*it).second) {
            block = &bl;
            break;
        }
    }

    if (!block) {
        ThrowException("There is not a single `Scene` record to load");
    }

    file.reader->SetCurrentPos(block->start);
    ss.Convert(out,file);

#ifndef ASSIMP_BUILD_BLENDER_NO_STATS
    ASSIMP_LOG_INFO_F(
        "(Stats) Fields read: " ,file.stats().fields_read,
        ", pointers resolved: " ,file.stats().pointers_resolved,
        ", cache hits: "        ,file.stats().cache_hits,
        ", cached objects: "    ,file.stats().cached_objects
    );
#endif
}